

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O0

size_t derSIDDec2(u32 val,char *oid)

{
  size_t sVar1;
  u32 t;
  size_t pos;
  size_t count;
  char *oid_local;
  u32 val_local;
  
  count = 0;
  t = val;
  sVar1 = count;
  do {
    count = sVar1;
    t = t / 10;
    sVar1 = count + 1;
  } while (t != 0);
  t = val;
  pos = count;
  if ((int)oid[count] == (char)((ulong)val % 10) + 0x30) {
    do {
      sVar1 = pos - 1;
      if (pos == 0) {
        return count + 1;
      }
      t = t / 10;
      pos = sVar1;
    } while ((int)oid[sVar1] == (char)((ulong)t % 10) + 0x30);
  }
  return 0xffffffffffffffff;
}

Assistant:

static size_t derSIDDec2(u32 val, const char* oid)
{
	size_t count = 0, pos;
	u32 t = val;
	// число символов для val
	do
		t /= 10, count++;
	while (t > 0);
	// сравнение
	ASSERT(strIsValid(oid));
	pos = count - 1;
	if (oid[pos] != '0' + (char)((t = val) % 10))
		return SIZE_MAX;
	while (pos--)
	{
		t /= 10;
		if (oid[pos] != '0' + (char)(t % 10))
			return SIZE_MAX;
	}
	return count;
}